

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_iter.cpp
# Opt level: O0

int ON_SubDSectorId::Compare(ON_SubDSectorId lhs,ON_SubDSectorId rhs)

{
  undefined4 local_34;
  undefined4 uStack_30;
  ON_SubDSectorId rhs_local;
  undefined4 local_18;
  undefined4 uStack_14;
  ON_SubDSectorId lhs_local;
  
  local_18 = lhs.m_vertex_id;
  local_34 = rhs.m_vertex_id;
  if (local_18 < local_34) {
    lhs_local.m_minimum_face_id = 0xffffffff;
  }
  else if (local_34 < local_18) {
    lhs_local.m_minimum_face_id = 1;
  }
  else {
    uStack_14 = lhs.m_minimum_face_id;
    uStack_30 = rhs.m_minimum_face_id;
    if (uStack_14 < uStack_30) {
      lhs_local.m_minimum_face_id = 0xffffffff;
    }
    else if (uStack_30 < uStack_14) {
      lhs_local.m_minimum_face_id = 1;
    }
    else if (lhs.m_sector_face_count < rhs.m_sector_face_count) {
      lhs_local.m_minimum_face_id = 0xffffffff;
    }
    else if (rhs.m_sector_face_count < lhs.m_sector_face_count) {
      lhs_local.m_minimum_face_id = 1;
    }
    else {
      lhs_local.m_minimum_face_id = 0;
    }
  }
  return lhs_local.m_minimum_face_id;
}

Assistant:

int ON_SubDSectorId::Compare(ON_SubDSectorId lhs, ON_SubDSectorId rhs)
{
  if (lhs.m_vertex_id < rhs.m_vertex_id)
    return -1;
  if (lhs.m_vertex_id > rhs.m_vertex_id)
    return 1;
  if (lhs.m_minimum_face_id < rhs.m_minimum_face_id)
    return -1;
  if (lhs.m_minimum_face_id > rhs.m_minimum_face_id)
    return 1;
  if (lhs.m_sector_face_count < rhs.m_sector_face_count)
    return -1;
  if (lhs.m_sector_face_count > rhs.m_sector_face_count)
    return 1;
  return 0;
}